

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Matrix * __thiscall Matrix::integrate(Matrix *this)

{
  uint uVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  void *__s;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  iVar3 = this->nMatrixDimension;
  uVar1 = iVar3 - 1;
  uVar9 = 0xffffffffffffffff;
  if (0 < iVar3) {
    uVar9 = (long)(int)uVar1 * 4;
  }
  __s = operator_new__(uVar9);
  if (1 < iVar3) {
    memset(__s,0,(ulong)uVar1 << 2);
  }
  pdVar4 = this->pData;
  piVar5 = this->pSize;
  piVar6 = this->pMult;
  bVar7 = false;
  do {
    bVar8 = bVar7;
    if (uVar1 == 0) {
      bVar8 = true;
    }
    lVar12 = (long)(iVar3 + -2);
    if (iVar3 != 1) {
      do {
        bVar8 = bVar7;
        iVar11 = *(int *)((long)__s + lVar12 * 4) + 1;
        *(int *)((long)__s + lVar12 * 4) = iVar11;
        if (iVar11 != piVar5[lVar12]) break;
        *(undefined4 *)((long)__s + lVar12 * 4) = 0;
        lVar10 = lVar12 + -1;
        if (lVar12 == 0) {
          bVar8 = true;
        }
        lVar12 = lVar10;
        bVar7 = bVar8;
      } while (lVar10 != -1);
    }
    if (iVar3 < 2) {
      lVar12 = 0;
    }
    else {
      uVar9 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + piVar6[uVar9] * *(int *)((long)__s + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      lVar12 = (long)iVar11;
    }
    lVar10 = (long)piVar5[(int)uVar1];
    if (1 < lVar10) {
      pdVar2 = pdVar4 + lVar12;
      dVar13 = *pdVar2;
      lVar12 = 1;
      do {
        dVar13 = dVar13 + pdVar2[lVar12];
        pdVar2[lVar12] = dVar13;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    bVar7 = bVar8;
    if (bVar8) {
      operator_delete__(__s);
      return this;
    }
  } while( true );
}

Assistant:

Matrix &Matrix::integrate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// integrate last dimension of this offset
		for (int i=1; i<pSize[n]; ++i)
			pData[offset+i] += pData[offset + i-1];
	}
	
	delete[] indices;
	return *this;
}